

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar7;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar8;
  value_type vVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  vVar9 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar10 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ -
               ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar5 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar1 = (pFVar5->dx_).ptr_to_data[i];
  dVar11 = cos((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ - pFVar5->val_);
  pFVar6 = (((this->left_->fadexpr_).left_)->fadexpr_).expr_;
  pFVar7 = (pFVar6->fadexpr_).left_;
  dVar2 = (*(Fad<double> **)((long)&pFVar7->fadexpr_ + 0x10))->val_;
  dVar3 = (pFVar7->fadexpr_).left_.constant_;
  dVar4 = (pFVar6->fadexpr_).right_.constant_;
  pFVar8 = (this->left_->fadexpr_).right_;
  pFVar7 = (pFVar8->fadexpr_).expr_.fadexpr_.left_;
  dVar12 = cos(((pFVar7->fadexpr_).left_.constant_ * ((pFVar7->fadexpr_).right_)->val_) /
               (pFVar8->fadexpr_).expr_.fadexpr_.right_.constant_);
  return dVar12 * ((dVar2 * dVar3) / dVar4) * dVar11 * dVar1 + dVar10 * vVar9;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}